

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

QRect __thiscall
QtMWidgets::SliderPrivate::grooveHighlightedRect(SliderPrivate *this,QRect *sh,QRect *gr)

{
  char cVar1;
  int iVar2;
  QRect QVar3;
  QMargins local_30;
  
  cVar1 = QAbstractSlider::invertedAppearance();
  iVar2 = QAbstractSlider::orientation();
  if (cVar1 == '\0') {
    if (iVar2 == 2) {
      local_30.m_bottom = (gr->y2 - (gr->y1 + sh->y1 + this->radius)) + 1;
      local_30.m_right = 0;
    }
    else {
      local_30.m_right = (gr->x2 - (gr->x1 + sh->x1 + this->radius)) + 1;
      local_30.m_bottom = 0;
    }
    local_30.m_left = 0;
    local_30.m_top = 0;
  }
  else {
    if (iVar2 == 2) {
      local_30.m_top = this->radius + sh->y1;
      local_30.m_left = 0;
    }
    else {
      local_30.m_left = this->radius + sh->x1;
      local_30.m_top = 0;
    }
    local_30.m_right = 0;
    local_30.m_bottom = 0;
  }
  QVar3 = QRect::marginsRemoved(gr,&local_30);
  return QVar3;
}

Assistant:

QRect
SliderPrivate::grooveHighlightedRect( const QRect & sh, const QRect & gr ) const
{
	int grhw = 0, grhh = 0;

	QRect grh;

	if( !q->invertedAppearance() )
	{
		if( q->orientation() == Qt::Vertical )
			grhh = gr.height() - sh.y() - radius;
		else
			grhw = gr.width() - sh.x() - radius;

		grh = gr.marginsRemoved( QMargins( 0, 0, grhw, grhh ) );
	}
	else
	{
		if( q->orientation() == Qt::Vertical )
			grhh = sh.y() + radius;
		else
			grhw = sh.x() + radius;

		grh = gr.marginsRemoved( QMargins( grhw, grhh, 0, 0 ) );
	}

	return grh;
}